

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges,uint minimum_chain_length,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  ulong uVar1;
  uint uVar2;
  uint i;
  ulong uVar3;
  ulong new_capacity;
  ON_SimpleArray<const_ON_SubDEdge_*> a;
  ON_SubDEdge *local_50;
  ON_SimpleArray<const_ON_SubDEdge_*> local_48;
  
  new_capacity = (ulong)(uint)unsorted_edges->m_count;
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819ea0;
  local_48.m_a = (ON_SubDEdge **)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  if (new_capacity != 0) {
    ON_SimpleArray<const_ON_SubDEdge_*>::SetCapacity(&local_48,new_capacity);
    uVar3 = 0;
    do {
      uVar1 = unsorted_edges->m_a[uVar3].m_ptr;
      local_50 = (ON_SubDEdge *)(uVar1 & 0xfffffffffffffff8);
      if (((uint)uVar1 & 6) != 4) {
        local_50 = (ON_SubDEdge *)0x0;
      }
      ON_SimpleArray<const_ON_SubDEdge_*>::Append(&local_48,&local_50);
      uVar3 = uVar3 + 1;
    } while (new_capacity != uVar3);
  }
  uVar2 = SortEdgesIntoEdgeChains(&local_48,minimum_chain_length,sorted_edges,false);
  ON_SimpleArray<const_ON_SubDEdge_*>::~ON_SimpleArray(&local_48);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& unsorted_edges,
  unsigned int minimum_chain_length,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  const unsigned count = unsorted_edges.UnsignedCount();
  ON_SimpleArray< const ON_SubDEdge* > a(count);
  for (unsigned i = 0; i < count; ++i)
    a.Append(unsorted_edges[i].Edge());
  return ON_SubDEdgeChain::SortEdgesIntoEdgeChains(a, minimum_chain_length, sorted_edges);
}